

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

iteration_time __thiscall
helics::FederateState::enterExecutingMode
          (FederateState *this,IterationRequest iterate,bool sendRequest)

{
  _Impl *p_Var1;
  __atomic_flag_data_type _Var2;
  FederateStates FVar3;
  MessageProcessingResult result;
  undefined7 extraout_var;
  pointer p_Var4;
  rep rVar5;
  Time TVar6;
  ulong uVar7;
  iteration_time iVar8;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<helics::MessageTimer,_std::allocator<helics::MessageTimer>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_108;
  __shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2> local_f8;
  ActionMessage exec;
  
  LOCK();
  _Var2 = (this->processing).super___atomic_flag_base._M_i;
  (this->processing).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var2 == false) {
    if (sendRequest) {
      ActionMessage::ActionMessage(&exec,cmd_exec_request);
      exec.source_id.gid = (this->global_id)._M_i.gid;
      setIterationFlags(&exec,iterate);
      exec._24_8_ = exec._24_8_ | 0x200000;
      addAction(this,&exec);
      ActionMessage::~ActionMessage(&exec);
    }
    result = processQueue(this);
    uVar7 = CONCAT71(extraout_var,result) & 0xffffffff;
    updateDataForExecEntry(this,result,iterate);
    LOCK();
    (this->processing).super___atomic_flag_base._M_i = false;
    UNLOCK();
    if (((char)uVar7 == '\0') && (this->realtime != false)) {
      if ((this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (element_type *)0x0) {
        p_Var4 = std::
                 allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<helics::MessageTimer,_std::allocator<helics::MessageTimer>,_(__gnu_cxx::_Lock_policy)2>_>_>
                 ::allocate(&__a2,1);
        (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
        (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
        (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
             (_func_int **)&PTR___Sp_counted_ptr_inplace_004e3ca0;
        p_Var1 = &p_Var4->_M_impl;
        exec.source_id.gid = 0;
        exec.source_handle.hid = 0;
        exec._24_8_ = std::
                      _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:590:21)>
                      ::_M_invoke;
        exec._16_8_ = std::
                      _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:590:21)>
                      ::_M_manager;
        local_108._M_alloc = &__a2;
        local_108._M_ptr = p_Var4;
        exec._0_8_ = this;
        MessageTimer::MessageTimer
                  ((MessageTimer *)p_Var1,(function<void_(helics::ActionMessage_&&)> *)&exec);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&exec);
        local_108._M_ptr = (pointer)0x0;
        local_f8._M_ptr = (element_type *)p_Var1;
        local_f8._M_refcount._M_pi = &p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
        std::
        __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<helics::MessageTimer,_std::allocator<helics::MessageTimer>,_(__gnu_cxx::_Lock_policy)2>_>_>
        ::~__allocated_ptr(&local_108);
        std::__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2>::
        _M_enable_shared_from_this_with<helics::MessageTimer,helics::MessageTimer>
                  ((__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2> *)&local_f8,
                   (MessageTimer *)p_Var1);
        std::__shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(this->mTimer).
                    super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>,&local_f8);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_refcount);
      }
      rVar5 = std::chrono::_V2::steady_clock::now();
      (this->start_clock_time).__d.__r = rVar5;
    }
    else if ((0 < (this->grantTimeOutPeriod).internalTimeCode) &&
            ((this->mTimer).super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr == (element_type *)0x0)) {
      p_Var4 = std::
               allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<helics::MessageTimer,_std::allocator<helics::MessageTimer>,_(__gnu_cxx::_Lock_policy)2>_>_>
               ::allocate(&__a2,1);
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_004e3ca0;
      p_Var1 = &p_Var4->_M_impl;
      exec.source_id.gid = 0;
      exec.source_handle.hid = 0;
      exec._24_8_ = std::
                    _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:596:21)>
                    ::_M_invoke;
      exec._16_8_ = std::
                    _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/FederateState.cpp:596:21)>
                    ::_M_manager;
      local_108._M_alloc = &__a2;
      local_108._M_ptr = p_Var4;
      exec._0_8_ = this;
      MessageTimer::MessageTimer
                ((MessageTimer *)p_Var1,(function<void_(helics::ActionMessage_&&)> *)&exec);
      CLI::std::_Function_base::~_Function_base((_Function_base *)&exec);
      local_108._M_ptr = (pointer)0x0;
      local_f8._M_ptr = (element_type *)p_Var1;
      local_f8._M_refcount._M_pi = &p_Var4->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<helics::MessageTimer,_std::allocator<helics::MessageTimer>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr(&local_108);
      std::__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2>::
      _M_enable_shared_from_this_with<helics::MessageTimer,helics::MessageTimer>
                ((__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2> *)&local_f8,
                 (MessageTimer *)p_Var1);
      std::__shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->mTimer).
                  super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>,&local_f8);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_refcount);
    }
    TVar6.internalTimeCode = (this->time_granted).internalTimeCode;
  }
  else {
    if (((this->queueProcessing)._M_base._M_i & 1U) == 0) {
      sched_yield();
      if (((this->queueProcessing)._M_base._M_i & 1U) == 0) {
        iVar8 = enterExecutingMode(this,iterate,sendRequest);
        TVar6 = iVar8.grantedTime.internalTimeCode;
        uVar7 = (ulong)iVar8._8_4_;
        goto LAB_002a80b3;
      }
    }
    sleeplock(this);
    FVar3 = (this->state)._M_i;
    uVar7 = 2;
    if (FVar3 < UNKNOWN) {
      uVar7 = 0x30702000202 >> (FVar3 * '\b' & 0x3f);
    }
    uVar7 = uVar7 & 0xffffffff;
    TVar6.internalTimeCode = (this->time_granted).internalTimeCode;
    LOCK();
    (this->processing).super___atomic_flag_base._M_i = false;
    UNLOCK();
  }
LAB_002a80b3:
  iVar8._8_8_ = uVar7;
  iVar8.grantedTime.internalTimeCode = TVar6.internalTimeCode;
  return iVar8;
}

Assistant:

iteration_time FederateState::enterExecutingMode(IterationRequest iterate, bool sendRequest)
{
    if (try_lock()) {  // only enter this loop once per federate
        // timeCoord->enteringExecMode (iterate);
        if (sendRequest) {
            ActionMessage exec(CMD_EXEC_REQUEST);
            exec.source_id = global_id.load();
            setIterationFlags(exec, iterate);
            setActionFlag(exec, indicator_flag);
            addAction(exec);
        }

        auto ret = processQueue();
        updateDataForExecEntry(ret, iterate);
        unlock();
#ifndef HELICS_DISABLE_ASIO
        if ((realtime) && (ret == MessageProcessingResult::NEXT_STEP)) {
            if (!mTimer) {
                mTimer = std::make_shared<MessageTimer>(
                    [this](ActionMessage&& mess) { return this->addAction(std::move(mess)); });
            }
            start_clock_time = std::chrono::steady_clock::now();
        } else if (grantTimeOutPeriod > timeZero) {
            if (!mTimer) {
                mTimer = std::make_shared<MessageTimer>(
                    [this](ActionMessage&& mess) { return this->addAction(std::move(mess)); });
            }
        }
#endif
        return {time_granted, static_cast<IterationResult>(ret)};
    }

    // if this is not true then try again the core may have been handing something short so try
    // again
    if (!queueProcessing.load()) {
        std::this_thread::yield();
        if (!queueProcessing.load()) {
            return enterExecutingMode(iterate, sendRequest);
        }
    }

    // the following code is for a situation in which this method has been called multiple times
    // from different threads, which really shouldn't be done but it isn't really an error so we
    // need to deal with it.
    const std::lock_guard<FederateState> plock(*this);
    IterationResult ret;
    switch (getState()) {
        case FederateStates::ERRORED:
            ret = IterationResult::ERROR_RESULT;
            break;
        case FederateStates::FINISHED:
            ret = IterationResult::HALTED;
            break;
        case FederateStates::CREATED:
        case FederateStates::INITIALIZING:
        default:
            ret = IterationResult::ITERATING;
            break;
        case FederateStates::EXECUTING:
            ret = IterationResult::NEXT_STEP;
            break;
    }
    return {time_granted, ret};
}